

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

RawSchema * __thiscall capnp::SchemaLoader::Impl::load(Impl *this,Reader *reader,bool isPlaceholder)

{
  Initializer *pIVar1;
  Impl *pIVar2;
  bool bVar3;
  bool bVar4;
  RawSchema *schema;
  uint64_t uVar5;
  RawSchema **ppRVar6;
  uint16_t *puVar7;
  Which kind;
  Impl *pIVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  ArrayPtr<capnp::word> AVar13;
  StringPtr name;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> AVar14;
  Reader validatedReader;
  Reader existing;
  CompatibilityChecker checker;
  Validator validator;
  StructReader local_1e8;
  StructReader local_1b8;
  CompatibilityChecker local_188;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_108;
  Validator local_f0;
  
  AVar13 = makeUncheckedNodeEnforcingSizeRequirements(this,(Reader)reader->_reader);
  Validator::Validator(&local_f0,this);
  local_188.loader = (Impl *)0x0;
  local_188.nodeName.super_StringPtr.content.ptr = (char *)0x0;
  local_188.existingNode._reader.segment._0_4_ = 0x7fffffff;
  local_188.nodeName.super_StringPtr.content.size_ = (size_t)AVar13.ptr;
  _::PointerReader::getStruct(&local_1e8,(PointerReader *)&local_188,(word *)0x0);
  bVar3 = Validator::validate(&local_f0,(Reader *)&local_1e8);
  if (!bVar3) {
    if (local_1e8.dataSize < 0x40) {
      uVar5 = 0;
    }
    else {
      uVar5 = *local_1e8.data;
    }
    bVar3 = local_1e8.pointerCount == 0;
    local_188.nodeName.super_StringPtr.content.size_ = (size_t)local_1e8.pointers;
    if (bVar3) {
      local_188.nodeName.super_StringPtr.content.size_ = (size_t)(WirePointer *)0x0;
    }
    local_188.existingNode._reader.segment._0_4_ = 0x7fffffff;
    if (!bVar3) {
      local_188.existingNode._reader.segment._0_4_ = local_1e8.nestingLimit;
    }
    uVar9 = 0;
    uVar10 = 0;
    uVar11 = 0;
    uVar12 = 0;
    if (!bVar3) {
      uVar9 = local_1e8.segment._0_4_;
      uVar10 = local_1e8.segment._4_4_;
      uVar11 = local_1e8.capTable._0_4_;
      uVar12 = local_1e8.capTable._4_4_;
    }
    local_188.loader = (Impl *)CONCAT44(uVar10,uVar9);
    local_188.nodeName.super_StringPtr.content.ptr = (char *)CONCAT44(uVar12,uVar11);
    name.content = (ArrayPtr<const_char>)
                   _::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_188,(void *)0x0,0)
    ;
    if (local_1e8.dataSize < 0x70) {
      kind = FILE;
    }
    else {
      kind = *(Which *)((long)local_1e8.data + 0xc);
    }
    schema = loadEmpty(this,uVar5,name,kind,false);
    goto LAB_00138304;
  }
  if (local_1e8.dataSize < 0x40) {
    local_1b8.segment = (SegmentReader *)0x0;
  }
  else {
    local_1b8.segment = *local_1e8.data;
  }
  kj::
  Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
  ::find<0ul,unsigned_long&>
            ((Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
              *)&local_188,(unsigned_long *)&this->schemas);
  if (local_188.loader == (Impl *)0x0) {
    schema = (RawSchema *)kj::Arena::allocateBytes(&this->arena,0x78,8,false);
    uVar5 = 0;
    *(undefined8 *)&schema->mayContainCapabilities = 0;
    (schema->defaultBrand).scopes = (Scope *)0x0;
    (schema->defaultBrand).dependencies = (Dependency *)0x0;
    schema->lazyInitializer = (Initializer *)0x0;
    (schema->defaultBrand).generic = (RawSchema *)0x0;
    (schema->defaultBrand).scopeCount = 0;
    (schema->defaultBrand).dependencyCount = 0;
    (schema->defaultBrand).lazyInitializer = (Initializer *)0x0;
    schema->membersByDiscriminant = (uint16_t *)0x0;
    schema->canCastTo = (RawSchema *)0x0;
    schema->membersByName = (uint16_t *)0x0;
    schema->dependencyCount = 0;
    schema->memberCount = 0;
    *(undefined8 *)&schema->encodedSize = 0;
    schema->dependencies = (RawSchema **)0x0;
    schema->id = 0;
    schema->encodedNode = (word *)0x0;
    schema->mayContainCapabilities = true;
    (schema->defaultBrand).generic = (RawSchema *)0x0;
    (schema->defaultBrand).scopes = (Scope *)0x0;
    (schema->defaultBrand).dependencies = (Dependency *)0x0;
    (schema->defaultBrand).scopeCount = 0;
    (schema->defaultBrand).dependencyCount = 0;
    (schema->defaultBrand).lazyInitializer = (Initializer *)0x0;
    if (0x3f < local_1e8.dataSize) {
      uVar5 = *local_1e8.data;
    }
    local_188.loader = (Impl *)0x0;
    pIVar8 = (Impl *)&this->brandedInitializer;
    pIVar2 = (Impl *)&this->initializer;
    if (!isPlaceholder) {
      pIVar8 = local_188.loader;
      pIVar2 = local_188.loader;
    }
    schema->id = uVar5;
    schema->canCastTo = (RawSchema *)0x0;
    (schema->defaultBrand).generic = schema;
    schema->lazyInitializer = (Initializer *)pIVar2;
    (schema->defaultBrand).lazyInitializer = (Initializer *)pIVar8;
    if (0x3f < local_1e8.dataSize) {
      local_188.loader = *local_1e8.data;
    }
    local_188.nodeName.super_StringPtr.content.ptr = (char *)schema;
    kj::
    Table<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Callbacks>_>
    ::insert(&(this->schemas).table,(Entry *)&local_188);
    bVar3 = false;
LAB_00138281:
    schema->encodedNode = (word *)AVar13.ptr;
    schema->encodedSize = (uint32_t)AVar13.size_;
    ppRVar6 = Validator::makeDependencyArray(&local_f0,&schema->dependencyCount);
    schema->dependencies = ppRVar6;
    puVar7 = Validator::makeMemberInfoArray(&local_f0,&schema->memberCount);
    schema->membersByName = puVar7;
    schema->membersByDiscriminant = local_f0.membersByDiscriminant.ptr;
    local_108.ptr.field_1.value.ptr = (Scope *)0x0;
    local_108.ptr.field_1.value.size_ = 0;
    local_108.ptr.isSet = true;
    AVar14 = makeBrandedDependencies(this,schema,&local_108);
    (schema->defaultBrand).dependencies = AVar14.ptr;
    (schema->defaultBrand).dependencyCount = (uint32_t)AVar14.size_;
  }
  else {
    schema = (RawSchema *)((local_188.loader)->arena).chunkList;
    pIVar1 = schema->lazyInitializer;
    local_188.nodeName.super_StringPtr.content.size_ = (size_t)schema->encodedNode;
    local_188.loader = (Impl *)0x0;
    local_188.nodeName.super_StringPtr.content.ptr = (char *)0x0;
    local_188.existingNode._reader.segment =
         (SegmentReader *)CONCAT44(local_188.existingNode._reader.segment._4_4_,0x7fffffff);
    _::PointerReader::getStruct(&local_1b8,(PointerReader *)&local_188,(word *)0x0);
    local_188.nodeName.super_StringPtr.content.ptr = "";
    local_188.nodeName.super_StringPtr.content.size_ = 1;
    local_188.existingNode._reader.segment._0_4_ = 0;
    local_188.existingNode._reader.segment._4_4_ = 0;
    local_188.existingNode._reader.capTable = (CapTableReader *)0x0;
    local_188.existingNode._reader.data = (void *)0x0;
    local_188.existingNode._reader.pointers._0_6_ = 0;
    local_188.existingNode._reader.pointers._6_2_ = 0;
    local_188.existingNode._reader.dataSize = 0;
    local_188.existingNode._reader.pointerCount = 0;
    local_188.existingNode._reader.nestingLimit = 0x7fffffff;
    local_188.replacementNode._reader.segment = (SegmentReader *)0x0;
    local_188.replacementNode._reader.capTable = (CapTableReader *)0x0;
    local_188.replacementNode._reader.data = (void *)0x0;
    local_188.replacementNode._reader.pointers._0_6_ = 0;
    local_188.replacementNode._reader.pointers._6_2_ = 0;
    local_188.replacementNode._reader.dataSize = 0;
    local_188.replacementNode._reader.pointerCount = 0;
    local_188.replacementNode._reader.nestingLimit = 0x7fffffff;
    local_188.loader = this;
    bVar4 = CompatibilityChecker::shouldReplace
                      (&local_188,(Reader *)&local_1b8,(Reader *)&local_1e8,
                       schema->lazyInitializer != (Initializer *)0x0);
    bVar3 = pIVar1 != (Initializer *)0x0 && !isPlaceholder;
    if (bVar4) goto LAB_00138281;
  }
  if (bVar3) {
    schema->lazyInitializer = (Initializer *)0x0;
    (schema->defaultBrand).lazyInitializer = (Initializer *)0x0;
  }
LAB_00138304:
  Validator::~Validator(&local_f0);
  return schema;
}

Assistant:

_::RawSchema* SchemaLoader::Impl::load(const schema::Node::Reader& reader, bool isPlaceholder) {
  // Make a copy of the node which can be used unchecked.
  kj::ArrayPtr<word> validated = makeUncheckedNodeEnforcingSizeRequirements(reader);

  // Validate the copy.
  Validator validator(*this);
  auto validatedReader = readMessageUnchecked<schema::Node>(validated.begin());

  if (!validator.validate(validatedReader)) {
    // Not valid.  Construct an empty schema of the same type and return that.
    return loadEmpty(validatedReader.getId(),
                     validatedReader.getDisplayName(),
                     validatedReader.which(),
                     false);
  }

  // Check if we already have a schema for this ID.
  _::RawSchema* schema;
  bool shouldReplace;
  bool shouldClearInitializer;
  KJ_IF_SOME(match, schemas.find(validatedReader.getId())) {
    // Yes, check if it is compatible and figure out which schema is newer.

    schema = match;

    // If the existing schema is a placeholder, but we're upgrading it to a non-placeholder, we
    // need to clear the initializer later.
    shouldClearInitializer = schema->lazyInitializer != nullptr && !isPlaceholder;

    auto existing = readMessageUnchecked<schema::Node>(schema->encodedNode);
    CompatibilityChecker checker(*this);

    // Prefer to replace the existing schema if the existing schema is a placeholder.  Otherwise,
    // prefer to keep the existing schema.
    shouldReplace = checker.shouldReplace(
        existing, validatedReader, schema->lazyInitializer != nullptr);
  } else {
    // Nope, allocate a new RawSchema.
    schema = &arena.allocate<_::RawSchema>();
    memset(&schema->defaultBrand, 0, sizeof(schema->defaultBrand));
    schema->id = validatedReader.getId();
    schema->canCastTo = nullptr;
    schema->defaultBrand.generic = schema;
    schema->lazyInitializer = isPlaceholder ? &initializer : nullptr;
    schema->defaultBrand.lazyInitializer = isPlaceholder ? &brandedInitializer : nullptr;
    shouldReplace = true;
    shouldClearInitializer = false;
    schemas.insert(validatedReader.getId(), schema);
  }